

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csprng.cpp
# Opt level: O0

result_type __thiscall jbcoin::csprng_engine::operator()(csprng_engine *this)

{
  int iVar1;
  int result;
  lock_guard<std::mutex> lock;
  result_type ret;
  csprng_engine *this_local;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&stack0xffffffffffffffe0,&this->mutex_);
  iVar1 = RAND_bytes((uchar *)&lock,8);
  if (iVar1 == 0) {
    Throw<std::runtime_error,char_const(&)[21]>((char (*) [21])"Insufficient entropy");
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffffe0);
  return (result_type)lock._M_device;
}

Assistant:

csprng_engine::result_type
csprng_engine::operator()()
{
    result_type ret;

    std::lock_guard<std::mutex> lock (mutex_);

    auto const result = RAND_bytes (
        reinterpret_cast<unsigned char*>(&ret),
        sizeof(ret));

    if (result == 0)
        Throw<std::runtime_error> ("Insufficient entropy");

    return ret;
}